

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::SetColumnWidth(int column_index,float width)

{
  ImGuiColumns *pIVar1;
  float fVar2;
  
  pIVar1 = (GImGui->CurrentWindow->DC).CurrentColumns;
  if (pIVar1 != (ImGuiColumns *)0x0) {
    if (column_index < 0) {
      column_index = pIVar1->Current;
    }
    fVar2 = GetColumnOffset(column_index);
    SetColumnOffset(column_index + 1,fVar2 + width);
    return;
  }
  __assert_fail("columns != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_widgets.cpp"
                ,0x1c39,"void ImGui::SetColumnWidth(int, float)");
}

Assistant:

void ImGui::SetColumnWidth(int column_index, float width)
{
    ImGuiWindow* window = GetCurrentWindowRead();
    ImGuiColumns* columns = window->DC.CurrentColumns;
    IM_ASSERT(columns != NULL);

    if (column_index < 0)
        column_index = columns->Current;
    SetColumnOffset(column_index + 1, GetColumnOffset(column_index) + width);
}